

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pareto_dist.hpp
# Opt level: O0

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,param_type *P)

{
  undefined1 gamma_00 [16];
  undefined1 theta_00 [16];
  bool bVar1;
  _Ios_Fmtflags _Var2;
  ios_base *this;
  basic_istream<char,_std::char_traits<char>_> *pbVar3;
  undefined8 *in_RSI;
  basic_istream<char,_std::char_traits<char>_> *in_RDI;
  fmtflags flags;
  longdouble theta;
  longdouble gamma;
  delim_c *in_stack_ffffffffffffff58;
  undefined2 in_stack_ffffffffffffff60;
  undefined6 in_stack_ffffffffffffff62;
  undefined6 in_stack_ffffffffffffff72;
  param_type local_68;
  char local_3f;
  char local_3e;
  char local_3d;
  fmtflags local_3c;
  longdouble local_38;
  longdouble local_28;
  undefined8 *local_10;
  basic_istream<char,_std::char_traits<char>_> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_3c = Catch::clara::std::ios_base::flags
                       ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  this = (ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18));
  _Var2 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var2 = Catch::clara::std::operator|(_Var2,_S_left);
  Catch::clara::std::ios_base::flags(this,_Var2);
  local_3d = (char)utility::delim('\0');
  pbVar3 = utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)
                               CONCAT62(in_stack_ffffffffffffff62,in_stack_ffffffffffffff60),
                               in_stack_ffffffffffffff58);
  std::istream::operator>>((istream *)pbVar3,&local_28);
  local_3e = (char)utility::delim('\0');
  pbVar3 = utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)
                               CONCAT62(in_stack_ffffffffffffff62,in_stack_ffffffffffffff60),
                               in_stack_ffffffffffffff58);
  std::istream::operator>>((istream *)pbVar3,&local_38);
  local_3f = (char)utility::delim('\0');
  utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)
                      CONCAT62(in_stack_ffffffffffffff62,in_stack_ffffffffffffff60),
                      in_stack_ffffffffffffff58);
  bVar1 = std::ios::operator_cast_to_bool((ios *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
  if (bVar1) {
    gamma_00._10_6_ = in_stack_ffffffffffffff62;
    gamma_00._0_10_ = local_28;
    theta_00._10_6_ = in_stack_ffffffffffffff72;
    theta_00._0_10_ = local_38;
    pareto_dist<long_double>::param_type::param_type
              (&local_68,(result_type_conflict3)gamma_00,(result_type_conflict3)theta_00);
    *local_10 = local_68.gamma_._0_8_;
    local_10[1] = local_68.gamma_._8_8_;
    local_10[2] = local_68.theta_._0_8_;
    local_10[3] = local_68.theta_._8_8_;
  }
  Catch::clara::std::ios_base::flags
            ((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)),local_3c);
  return local_8;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
          std::basic_istream<char_t, traits_t> &in, param_type &P) {
        float_t gamma, theta;
        std::ios_base::fmtflags flags(in.flags());
        in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        in >> utility::delim('(') >> gamma >> utility::delim(' ') >> theta >>
            utility::delim(')');
        if (in)
          P = param_type(gamma, theta);
        in.flags(flags);
        return in;
      }